

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O1

int castmu(monst *mtmp,attack *mattk,boolean thinks_it_foundyou,boolean foundyou)

{
  byte bVar1;
  byte bVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  obj *poVar8;
  ulong uVar9;
  undefined *puVar10;
  byte bVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int tmp;
  
  bVar1 = mtmp->m_lev;
  if (mattk->adtyp == 0xf1) {
    if (bVar1 == 0) goto LAB_001c0c5f;
LAB_001c0be3:
    uVar13 = 0x28;
    do {
      uVar4 = mt_random();
      bVar2 = mattk->adtyp;
      bVar11 = (char)(uVar4 % (uint)bVar1) - 1;
      if (bVar2 == 0xf1) {
        if (0x15 < bVar11) goto LAB_001c0c2f;
        puVar10 = &DAT_002b1c18;
LAB_001c0c26:
        uVar4 = *(uint *)(puVar10 + (ulong)bVar11 * 4);
      }
      else {
        if (bVar11 < 0xd) {
          puVar10 = &DAT_002b1c70;
          goto LAB_001c0c26;
        }
LAB_001c0c2f:
        uVar4 = 0;
      }
      uVar15 = (uint)bVar2;
      if (thinks_it_foundyou == '\0') {
        if (bVar2 == 0xf0) {
          if ((uVar4 - 1 & 0xfffffffb) != 0) goto LAB_001c0e28;
        }
        else if (((uVar15 != 0xf1) || (10 < uVar4)) || ((0x716U >> (uVar4 & 0x1f) & 1) == 0))
        goto LAB_001c0e28;
        bVar3 = spell_would_be_useless(mtmp,uVar15,uVar4);
        if (bVar3 != '\0') {
LAB_001c0e28:
          if (foundyou == '\0') {
            return 0;
          }
          warning("spellcasting monster found you and doesn\'t know it?");
          return 0;
        }
        goto LAB_001c0caa;
      }
      if (uVar13 < 2) {
        uVar13 = 0;
        break;
      }
      uVar13 = uVar13 - 1;
      bVar3 = spell_would_be_useless(mtmp,uVar15,uVar4);
    } while (bVar3 != '\0');
    if (uVar13 == 0) {
      return 0;
    }
  }
  else {
    if (mattk->adtyp == 0xf0 && bVar1 != 0) goto LAB_001c0be3;
LAB_001c0c5f:
    uVar4 = 0;
  }
LAB_001c0caa:
  uVar13 = (uint)bVar1;
  if (((mtmp->field_0x61 & 1) != 0) || (mtmp->mspec_used != 0 || bVar1 == 0)) {
    if (mattk->adtyp == 0xf0) {
      bVar3 = (uVar4 - 1 & 0xfffffffb) == 0;
    }
    else if ((mattk->adtyp == 0xf1) && (uVar4 - 1 < 10)) {
      bVar3 = (&DAT_002b1ca4)[uVar4 - 1];
    }
    else {
      bVar3 = '\0';
    }
    cursetxt(mtmp,bVar3);
    return 0;
  }
  if ((mattk->adtyp & 0xfe) == 0xf0) {
    iVar6 = 2;
    if (mtmp->m_lev < 9) {
      iVar6 = 10 - (uint)mtmp->m_lev;
    }
    mtmp->mspec_used = iVar6;
    iVar14 = 0;
    if (mtmp->data->msound != '\x1f') {
      iVar14 = iVar6;
    }
    mtmp->mspec_used = iVar14;
  }
  if (thinks_it_foundyou != '\0' && foundyou == '\0') {
    if (mattk->adtyp == 0xf0) {
      if ((uVar4 - 1 & 0xfffffffb) != 0) goto LAB_001c0e7c;
    }
    else if (((mattk->adtyp != 0xf1) || (10 < uVar4)) || ((0x716U >> (uVar4 & 0x1f) & 1) == 0)) {
LAB_001c0e7c:
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
          if ((((u.uprops[0x1e].intrinsic != 0) ||
               ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
             ((pcVar7 = "Something", ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d'))))
          goto LAB_001c193b;
          if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001c1934;
          pcVar7 = "Something";
          if (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) || ((mtmp->data->mflags3 & 0x200) == 0))
          goto LAB_001c193b;
        }
LAB_001c18ce:
        uVar13 = *(uint *)&mtmp->field_0x60;
        if ((((uVar13 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar13 & 0x280) != 0) goto LAB_001c1934;
        }
        else {
          pcVar7 = "Something";
          if (((uVar13 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_001c193b;
        }
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar7 = Monnam(mtmp);
          goto LAB_001c193b;
        }
      }
      else {
        bVar3 = worm_known(level,mtmp);
        if (bVar3 != '\0') goto LAB_001c18ce;
      }
LAB_001c1934:
      pcVar7 = "Something";
LAB_001c193b:
      pcVar12 = "thin air";
      if (level->locations[mtmp->mux][mtmp->muy].typ == '\x13') {
        pcVar12 = "empty water";
      }
      pline("%s casts a spell at %s!",pcVar7,pcVar12);
      return 0;
    }
  }
  nomul(0,(char *)0x0);
  uVar5 = mt_random();
  uVar15 = 100;
  if ((mtmp->field_0x62 & 0x20) == 0) {
    uVar15 = 0x14;
  }
  if (uVar5 % (uVar13 * 10) < uVar15) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
          if (ublindf == (obj *)0x0) {
            return 0;
          }
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar3 = worm_known(level,mtmp);
      if (bVar3 == '\0') {
        return 0;
      }
    }
    uVar13 = *(uint *)&mtmp->field_0x60;
    if ((((uVar13 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar13 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar13 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if (flags.soundok != '\0') {
      pcVar7 = mon_nam(mtmp);
      pline("The air crackles around %s.",pcVar7);
      return 0;
    }
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
       ((((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
           || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))))
    goto LAB_001c1180;
LAB_001c112a:
    uVar15 = *(uint *)&mtmp->field_0x60;
    if (((uVar15 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar15 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001c1173;
      goto LAB_001c1180;
    }
    if ((uVar15 & 0x280) != 0) goto LAB_001c1180;
LAB_001c1173:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001c1180;
LAB_001c12f3:
    if (mtmp->wormno == '\0') {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
         (((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
            || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
          (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
            (((youmonst.data)->mflags3 & 0x100) == 0)) ||
           (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0)))))))
         ) goto LAB_001c141a;
LAB_001c13c4:
      uVar15 = *(uint *)&mtmp->field_0x60;
      if (((uVar15 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0))))
      {
        if (((uVar15 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_001c140d;
        goto LAB_001c141a;
      }
      if ((uVar15 & 0x280) != 0) goto LAB_001c141a;
LAB_001c140d:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_001c141a;
LAB_001c158d:
      pcVar7 = Monnam(mtmp);
    }
    else {
      bVar3 = worm_known(level,mtmp);
      if (bVar3 != '\0') goto LAB_001c13c4;
LAB_001c141a:
      if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
           ((poVar8 = which_armor(mtmp,4), poVar8 == (obj *)0x0 ||
            (poVar8 = which_armor(mtmp,4), poVar8->otyp != 0x4f)))) &&
          ((((u.uprops[0x1e].intrinsic != 0 ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
             ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
           (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
            (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar6 < 0x41)))))) ||
         (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
          (bVar3 = match_warn_of_mon(mtmp), bVar3 != '\0')))) goto LAB_001c158d;
      pcVar7 = "Something";
    }
    if (mattk->adtyp == 0xf0) {
      if ((uVar4 - 1 & 0xfffffffb) == 0) goto LAB_001c15c1;
LAB_001c15d7:
      if ((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
            (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) ||
          (u.uprops[0xd].blocked != 0)) ||
         ((u.uprops[0xc].intrinsic != 0 ||
          ((((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)) ||
            ((mtmp->data->mflags1 & 0x1000000) != 0)) ||
           ((pcVar12 = " at a spot near you", mtmp->mux == u.ux && (mtmp->muy == u.uy)))))))) {
        if (u.uprops[0x2d].extrinsic == 0) {
          pcVar12 = " at you";
        }
        else if (mtmp->mux == u.ux) {
          pcVar12 = " at your displaced image";
          if (mtmp->muy == u.uy) {
            pcVar12 = " at you";
          }
        }
        else {
          pcVar12 = " at your displaced image";
        }
      }
    }
    else {
      if (((mattk->adtyp != 0xf1) || (9 < uVar4 - 1)) || ((0x38bU >> (uVar4 - 1 & 0x1f) & 1) == 0))
      goto LAB_001c15d7;
LAB_001c15c1:
      pcVar12 = "";
    }
    pline("%s casts a spell%s!",pcVar7,pcVar12);
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 != '\0') goto LAB_001c112a;
LAB_001c1180:
    if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar8 = which_armor(mtmp,4), poVar8 == (obj *)0x0 ||
          (poVar8 = which_armor(mtmp,4), poVar8->otyp != 0x4f)))) &&
        ((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
           ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar6 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar3 = match_warn_of_mon(mtmp), bVar3 != '\0')))) goto LAB_001c12f3;
    if (mattk->adtyp == 0xf0) {
      if ((uVar4 - 1 & 0xfffffffb) != 0) goto LAB_001c12f3;
    }
    else if (((mattk->adtyp != 0xf1) || (10 < uVar4)) || ((0x716U >> (uVar4 & 0x1f) & 1) == 0))
    goto LAB_001c12f3;
  }
  if (foundyou == '\0') {
    iVar6 = 0;
    if ((mattk->adtyp & 0xfe) != 0xf0) {
      pcVar7 = Monnam(mtmp);
      warning("%s casting non-hand-to-hand version of hand-to-hand spell %d?",pcVar7,
              (ulong)mattk->adtyp);
      return 0;
    }
  }
  else {
    uVar9 = 0x1e;
    if (uVar13 < 0x1e) {
      uVar9 = (ulong)uVar13;
    }
    bVar1 = mattk->damd;
    iVar6 = (int)(uVar9 / 5);
    if (bVar1 == 0) {
      iVar6 = iVar6 + 1;
      iVar14 = iVar6;
      do {
        uVar13 = mt_random();
        iVar6 = iVar6 + uVar13 % 6;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    else {
      iVar6 = iVar6 + (uint)mattk->damn;
      for (iVar14 = iVar6; iVar14 != 0; iVar14 = iVar14 + -1) {
        uVar13 = mt_random();
        iVar6 = iVar6 + uVar13 % (uint)bVar1;
      }
    }
  }
  if (u.uprops[0x32].extrinsic != 0 || u.uprops[0x32].intrinsic != 0) {
    iVar6 = (iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1;
  }
  bVar1 = mattk->adtyp;
  if (bVar1 < 3) {
    if (bVar1 == 1) {
      pline("You are hit by a shower of missiles!");
      mana_damageu(iVar6,mtmp,(char *)0x0,0,'\x01');
    }
    else {
      if (bVar1 != 2) goto LAB_001c1842;
      pline("You\'re enveloped in flames!");
      fire_damageu(iVar6,mtmp,(char *)0x0,0,0,'\x01','\x01');
    }
  }
  else if (bVar1 == 3) {
    pline("You\'re covered in frost!");
    cold_damageu(iVar6,mtmp,(char *)0x0,0,0);
  }
  else if (bVar1 == 0xf0) {
    cast_cleric_spell(mtmp,iVar6,uVar4);
  }
  else {
    if (bVar1 != 0xf1) goto LAB_001c1842;
    cast_wizard_spell(mtmp,iVar6,uVar4);
  }
  iVar6 = 0;
LAB_001c1842:
  if (iVar6 != 0) {
    mdamageu(mtmp,iVar6);
  }
  return 1;
}

Assistant:

int castmu(struct monst *mtmp,
	   const struct attack *mattk,
	   boolean thinks_it_foundyou,
	   boolean foundyou)
{
	int	dmg, ml = mtmp->m_lev;
	int ret;
	int spellnum = 0;

	/* Three cases:
	 * -- monster is attacking you.  Search for a useful spell.
	 * -- monster thinks it's attacking you.  Search for a useful spell,
	 *    without checking for undirected.  If the spell found is directed,
	 *    it fails with cursetxt() and loss of mspec_used.
	 * -- monster isn't trying to attack.  Select a spell once.  Don't keep
	 *    searching; if that spell is not useful (or if it's directed),
	 *    return and do something else. 
	 * Since most spells are directed, this means that a monster that isn't
	 * attacking casts spells only a small portion of the time that an
	 * attacking monster does.
	 */
	if ((mattk->adtyp == AD_SPEL || mattk->adtyp == AD_CLRC) && ml) {
	    int cnt = 40;

	    do {
		spellnum = rn2(ml);
		if (mattk->adtyp == AD_SPEL)
		    spellnum = choose_magic_spell(spellnum);
		else
		    spellnum = choose_clerical_spell(spellnum);
		/* not trying to attack?  don't allow directed spells */
		if (!thinks_it_foundyou) {
		    if (!is_undirected_spell(mattk->adtyp, spellnum) ||
			spell_would_be_useless(mtmp, mattk->adtyp, spellnum)) {
			if (foundyou)
			    warning("spellcasting monster found you and doesn't know it?");
			return 0;
		    }
		    break;
		}
	    } while (--cnt > 0 &&
		    spell_would_be_useless(mtmp, mattk->adtyp, spellnum));
	    if (cnt == 0) return 0;
	}

	/* monster unable to cast spells? */
	if (mtmp->mcan || mtmp->mspec_used || !ml) {
	    cursetxt(mtmp, is_undirected_spell(mattk->adtyp, spellnum));
	    return 0;
	}

	if (mattk->adtyp == AD_SPEL || mattk->adtyp == AD_CLRC) {
	    mtmp->mspec_used = 10 - mtmp->m_lev;
	    if (mtmp->mspec_used < 2) mtmp->mspec_used = 2;
	    /* your quest leader is a badass and does not need recharge time */
	    if (mtmp->data->msound == MS_LEADER) mtmp->mspec_used = 0;
	}

	/* monster can cast spells, but is casting a directed spell at the
	   wrong place?  If so, give a message, and return.  Do this *after*
	   penalizing mspec_used. */
	if (!foundyou && thinks_it_foundyou &&
		!is_undirected_spell(mattk->adtyp, spellnum)) {
	    pline("%s casts a spell at %s!",
		canseemon(level, mtmp) ? Monnam(mtmp) : "Something",
		level->locations[mtmp->mux][mtmp->muy].typ == WATER
		    ? "empty water" : "thin air");
	    return 0;
	}

	nomul(0, NULL);
	if (rn2(ml*10) < (mtmp->mconf ? 100 : 20)) {	/* fumbled attack */
	    if (canseemon(level, mtmp) && flags.soundok)
		pline("The air crackles around %s.", mon_nam(mtmp));
	    return 0;
	}
	if (canspotmon(level, mtmp) || !is_undirected_spell(mattk->adtyp, spellnum)) {
	    pline("%s casts a spell%s!",
		  canspotmon(level, mtmp) ? Monnam(mtmp) : "Something",
		  is_undirected_spell(mattk->adtyp, spellnum) ? "" :
		  (Invisible && !perceives(mtmp->data) && 
		   (mtmp->mux != u.ux || mtmp->muy != u.uy)) ?
		  " at a spot near you" :
		  (Displaced && (mtmp->mux != u.ux || mtmp->muy != u.uy)) ?
		  " at your displaced image" :
		  " at you");
	}

/*
 *	As these are spells, the damage is related to the level
 *	of the monster casting the spell.
 */
	if (!foundyou) {
	    dmg = 0;
	    if (mattk->adtyp != AD_SPEL && mattk->adtyp != AD_CLRC) {
		warning(
	      "%s casting non-hand-to-hand version of hand-to-hand spell %d?",
			   Monnam(mtmp), mattk->adtyp);
		return 0;
	    }
	} else if (mattk->damd) {
	    dmg = dice(min(ml, 30) / 5 + mattk->damn, mattk->damd);
	} else {
	    dmg = dice(min(ml, 30) / 5 + 1, 6);
	}
	if (Half_spell_damage) dmg = (dmg+1) / 2;

	ret = 1;

	switch (mattk->adtyp) {

	    case AD_FIRE:
		pline("You're enveloped in flames!");
		fire_damageu(dmg, mtmp, NULL, 0, 0, TRUE, TRUE);
		dmg = 0;
		break;
	    case AD_COLD:
		pline("You're covered in frost!");
		cold_damageu(dmg, mtmp, NULL, 0, 0);
		dmg = 0;
		break;
	    case AD_MAGM:
		pline("You are hit by a shower of missiles!");
		mana_damageu(dmg, mtmp, NULL, 0, TRUE);
		dmg = 0;
		break;
	    case AD_SPEL:	/* wizard spell */
	    case AD_CLRC:       /* clerical spell */
	    {
		if (mattk->adtyp == AD_SPEL)
		    cast_wizard_spell(mtmp, dmg, spellnum);
		else
		    cast_cleric_spell(mtmp, dmg, spellnum);
		dmg = 0; /* done by the spell casting functions */
		break;
	    }
	}
	if (dmg) mdamageu(mtmp, dmg);
	return ret;
}